

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_io_check_integrity_fn(event_base *base,int fd,evmap_io *io_info,void *arg)

{
  event *peVar1;
  evmap_io *local_58;
  event **nextp;
  event *elm2;
  event *elm1;
  uint local_38;
  int n_close;
  int n_write;
  int n_read;
  event *ev;
  void *arg_local;
  evmap_io *io_info_local;
  int fd_local;
  event_base *base_local;
  
  n_close = 0;
  local_38 = 0;
  elm1._4_4_ = 0;
  if ((io_info->events).lh_first != (event *)0x0) {
    elm2 = (io_info->events).lh_first;
    nextp = (event **)(elm2->ev_).ev_io.ev_io_next.le_next;
    while (elm2 != (event *)0x0 && nextp != (event **)0x0) {
      if (elm2 == (event *)nextp) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3c0,"elm1 != elm2","evmap_io_check_integrity_fn");
      }
      elm2 = (elm2->ev_).ev_io.ev_io_next.le_next;
      peVar1 = nextp[9];
      if (peVar1 == (event *)0x0) break;
      if (elm2 == peVar1) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3c0,"elm1 != elm2","evmap_io_check_integrity_fn");
      }
      nextp = (event **)(peVar1->ev_).ev_io.ev_io_next.le_next;
    }
    elm2 = (io_info->events).lh_first;
    local_58 = io_info;
    while (elm2 != (event *)0x0) {
      if ((local_58->events).lh_first != elm2) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3c0,"*nextp == elm1","evmap_io_check_integrity_fn");
      }
      if (local_58 != (evmap_io *)(elm2->ev_).ev_io.ev_io_next.le_prev) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3c0,"nextp == elm1->ev_.ev_io.ev_io_next.le_prev",
                   "evmap_io_check_integrity_fn");
      }
      local_58 = (evmap_io *)&elm2->ev_;
      elm2 = (((anon_struct_32_2_255328d7_for_ev_io *)local_58)->ev_io_next).le_next;
    }
  }
  _n_write = (io_info->events).lh_first;
  while( true ) {
    if (_n_write == (event *)0x0) {
      if (n_close != (uint)io_info->nread) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3cf,"n_read == io_info->nread","evmap_io_check_integrity_fn");
      }
      if (local_38 != io_info->nwrite) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3d0,"n_write == io_info->nwrite","evmap_io_check_integrity_fn");
      }
      if (elm1._4_4_ != io_info->nclose) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3d1,"n_close == io_info->nclose","evmap_io_check_integrity_fn");
      }
      return 0;
    }
    if (((_n_write->ev_evcallback).evcb_flags & 2U) == 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x3c3,"ev->ev_flags & EVLIST_INSERTED","evmap_io_check_integrity_fn");
    }
    if (_n_write->ev_fd != fd) break;
    if ((_n_write->ev_events & 8U) != 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x3c5,"!(ev->ev_events & EV_SIGNAL)","evmap_io_check_integrity_fn");
    }
    if ((_n_write->ev_events & 0x86U) == 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x3c6,"(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))",
                 "evmap_io_check_integrity_fn");
    }
    if ((_n_write->ev_events & 2U) != 0) {
      n_close = n_close + 1;
    }
    if ((_n_write->ev_events & 4U) != 0) {
      local_38 = local_38 + 1;
    }
    if ((_n_write->ev_events & 0x80U) != 0) {
      elm1._4_4_ = elm1._4_4_ + 1;
    }
    _n_write = (_n_write->ev_).ev_io.ev_io_next.le_next;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
             ,0x3c4,"ev->ev_fd == fd","evmap_io_check_integrity_fn");
}

Assistant:

static int
evmap_io_check_integrity_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *io_info, void *arg)
{
	struct event *ev;
	int n_read = 0, n_write = 0, n_close = 0;

	/* First, make sure the list itself isn't corrupt. Otherwise,
	 * running LIST_FOREACH could be an exciting adventure. */
	EVUTIL_ASSERT_LIST_OK(&io_info->events, event, ev_io_next);

	LIST_FOREACH(ev, &io_info->events, ev_io_next) {
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_INSERTED);
		EVUTIL_ASSERT(ev->ev_fd == fd);
		EVUTIL_ASSERT(!(ev->ev_events & EV_SIGNAL));
		EVUTIL_ASSERT((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED)));
		if (ev->ev_events & EV_READ)
			++n_read;
		if (ev->ev_events & EV_WRITE)
			++n_write;
		if (ev->ev_events & EV_CLOSED)
			++n_close;
	}

	EVUTIL_ASSERT(n_read == io_info->nread);
	EVUTIL_ASSERT(n_write == io_info->nwrite);
	EVUTIL_ASSERT(n_close == io_info->nclose);

	return 0;
}